

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall TokenStream::next(Token *__return_storage_ptr__,TokenStream *this)

{
  unsigned_long_long uVar1;
  char cVar2;
  undefined3 uVar3;
  Token *pTVar4;
  
  if ((this->stash).super__Optional_base<Token,_true,_true>._M_payload.
      super__Optional_payload_base<Token>._M_engaged == false) {
    std::function<Token_()>::operator()(__return_storage_ptr__,&this->supplier);
  }
  else {
    pTVar4 = std::optional<Token>::value(&this->stash);
    cVar2 = pTVar4->value;
    uVar3 = *(undefined3 *)&pTVar4->field_0x15;
    __return_storage_ptr__->type = pTVar4->type;
    __return_storage_ptr__->value = cVar2;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uVar3;
    uVar1 = (pTVar4->span).end;
    (__return_storage_ptr__->span).begin = (pTVar4->span).begin;
    (__return_storage_ptr__->span).end = uVar1;
    if ((this->stash).super__Optional_base<Token,_true,_true>._M_payload.
        super__Optional_payload_base<Token>._M_engaged == true) {
      (this->stash).super__Optional_base<Token,_true,_true>._M_payload.
      super__Optional_payload_base<Token>._M_engaged = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto TokenStream::next() -> Token {
    if (!stash)
        return supplier();

    auto temp = stash.value();
    stash = std::nullopt;
    return temp;
}